

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Cpu.cpp
# Opt level: O3

void __thiscall Hes_Cpu::reset(Hes_Cpu *this)

{
  this->state = &this->state_;
  (this->state_).base = 0;
  (this->state_).time = 0;
  this->irq_time_ = 0x40000000;
  this->end_time_ = 0x40000000;
  (this->r).sp = '\0';
  (this->r).pc = 0;
  (this->r).a = '\0';
  (this->r).x = '\0';
  (this->r).y = '\0';
  (this->r).status = '\x04';
  return;
}

Assistant:

void Hes_Cpu::reset()
{
	check( state == &state_ );
	state = &state_;
	
	state_.time = 0;
	state_.base = 0;
	irq_time_   = future_hes_time;
	end_time_   = future_hes_time;
	
	r.status = st_i;
	r.sp     = 0;
	r.pc     = 0;
	r.a      = 0;
	r.x      = 0;
	r.y      = 0;
	
	blargg_verify_byte_order();
}